

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O1

void spsel_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t val)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  
  uVar1 = (uint)env->features;
  if ((uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar3 = env->uncached_cpsr & 0x1f;
      if (uVar3 == 0x10) {
        uVar2 = 0;
      }
      else if (uVar3 == 0x16) {
        uVar2 = 3;
      }
      else if (uVar3 == 0x1a) {
        uVar2 = 2;
      }
      else {
        if ((env->features >> 0x21 & 1) != 0) {
          bVar4 = uVar3 == 0x16;
          if (!bVar4) {
            bVar4 = ((env->cp15).scr_el3 & 1) == 0;
          }
          if (((uVar1 >> 0x1c & 1) == 0) && (uVar2 = 3, bVar4)) goto LAB_00620576;
        }
        uVar2 = 1;
      }
    }
    else {
      uVar2 = (ulong)(env->pstate >> 2 & 3);
    }
  }
  else {
    uVar2 = 1;
    if ((env->v7m).exception == 0) {
      uVar2 = (ulong)(~(env->v7m).control[(env->v7m).secure] & 1);
    }
  }
LAB_00620576:
  uVar1 = env->pstate;
  if (((uVar1 ^ (uint)val) & 1) != 0) {
    env->sp_el[-(uVar1 & 1) & (uint)uVar2] = env->xregs[0x1f];
    env->pstate = uVar1 & 0xfffffffe | (uint)val & 1;
    if (2 < (uint)uVar2 - 1) {
      __assert_fail("cur_el >= 1 && cur_el <= 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/internals.h"
                    ,0xdd,"void update_spsel(CPUARMState *, uint32_t)");
    }
    if ((val & 1) == 0) {
      uVar2 = val & 1;
    }
    env->xregs[0x1f] = env->sp_el[uVar2];
  }
  return;
}

Assistant:

static inline int arm_feature(CPUARMState *env, int feature)
{
    return (env->features & (1ULL << feature)) != 0;
}